

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

Cba_Man_t * Cba_ManDeriveFromGia(Gia_Man_t *pGia,int fUseXor)

{
  Abc_Nam_t *p;
  Vec_Ptr_t *pVVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Cba_Man_t *p_00;
  Cba_Ntk_t *pNtk;
  Vec_Int_t *vLit2Fon;
  int *__s;
  char *pcVar11;
  Vec_Int_t *p_01;
  int *piVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  Gia_Obj_t *pGVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int local_34;
  
  __s = (int *)0x0;
  p_00 = Cba_ManAlloc(pGia->pSpec,1,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,
                      (Hash_IntMan_t *)0x0);
  iVar6 = Abc_NamStrFindOrAdd(p_00->pStrs,pGia->pName,(int *)0x0);
  pNtk = Cba_NtkAlloc(p_00,iVar6,pGia->vCis->nSize,pGia->vCos->nSize,1000,2000,2000);
  iVar6 = pGia->nObjs;
  iVar14 = iVar6 * 2;
  vLit2Fon = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar18 = iVar14;
  }
  vLit2Fon->nCap = iVar18;
  if (iVar18 != 0) {
    __s = (int *)malloc((long)iVar18 << 2);
  }
  vLit2Fon->pArray = __s;
  vLit2Fon->nSize = iVar14;
  memset(__s,0xff,(long)iVar6 << 3);
  p = p_00->pMods;
  pcVar11 = Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
  iVar6 = Abc_NamStrFindOrAdd(p,pcVar11,&local_34);
  if (local_34 == 0) {
    if (iVar6 != pNtk->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x264,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  p_01 = &pNtk->vObjName;
  uVar10 = (pNtk->vObjType).nCap;
  if ((pNtk->vObjName).nCap < (int)uVar10) {
    piVar12 = (pNtk->vObjName).pArray;
    if (piVar12 == (int *)0x0) {
      piVar12 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar12 = (int *)realloc(piVar12,(long)(int)uVar10 << 2);
    }
    (pNtk->vObjName).pArray = piVar12;
    if (piVar12 == (int *)0x0) goto LAB_00339a14;
    p_01->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vObjName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vObjName).nSize = uVar10;
  pVVar13 = pGia->vCis;
  if (0 < pVVar13->nSize) {
    uVar20 = 0;
    do {
      uVar10 = pVVar13->pArray[uVar20];
      if (((int)uVar10 < 0) || (iVar6 = pGia->nObjs, iVar6 <= (int)uVar10)) goto LAB_003398aa;
      if ((ulong)uVar10 == 0) goto LAB_0033901f;
      pVVar1 = pGia->vNamesIn;
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        iVar6 = Cba_NtkNewStrId(pNtk,"i%d",uVar20 & 0xffffffff);
      }
      else {
        if ((long)pVVar1->nSize <= (long)uVar20) goto LAB_003399d6;
        iVar6 = Abc_NamStrFindOrAdd(p_00->pStrs,(char *)pVVar1->pArray[uVar20],(int *)0x0);
      }
      uVar7 = Cba_ObjAlloc(pNtk,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(pNtk,uVar7,iVar6);
      if ((int)uVar7 < 1) goto LAB_003398fd;
      if ((pNtk->vObjFon0).nSize <= (int)uVar7) goto LAB_0033986c;
      if (iVar14 <= (int)(uVar10 * 2)) goto LAB_0033995a;
      __s[(ulong)uVar10 * 2] = (pNtk->vObjFon0).pArray[uVar7];
      uVar20 = uVar20 + 1;
      pVVar13 = pGia->vCis;
    } while ((long)uVar20 < (long)pVVar13->nSize);
  }
  iVar6 = pGia->nObjs;
  if (0 < iVar6) {
LAB_0033901f:
    iVar18 = 0;
    lVar17 = 0;
    lVar16 = 0;
    do {
      pGVar2 = pGia->pObjs;
      uVar20 = *(ulong *)(&pGVar2->field_0x0 + lVar17);
      uVar10 = (uint)uVar20;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        if ((int)((int)lVar16 - (uVar10 & 0x1fffffff)) < 0) goto LAB_003398d2;
        uVar7 = (uint)(uVar20 >> 0x20) & 0x1fffffff;
        if ((int)((int)lVar16 - uVar7) < 0) goto LAB_003398d2;
        pGVar15 = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar17);
        iVar6 = Cba_NtkInsertGiaLit(pNtk,iVar18 + (uint)((uVar10 >> 0x1d & 1) != 0) +
                                         (uVar10 & 0x1fffffff) * -2,vLit2Fon,fUseXor);
        iVar8 = Cba_NtkInsertGiaLit(pNtk,iVar18 + (uint)((uVar20 >> 0x3d & 1) != 0) + uVar7 * -2,
                                    vLit2Fon,fUseXor);
        pGVar3 = pGia->pObjs;
        if ((pGVar15 < pGVar3) || (pGVar3 + pGia->nObjs <= pGVar15)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar4 = pGia->pMuxes;
        if ((puVar4 == (uint *)0x0) ||
           (puVar4[(int)((ulong)((long)pGVar2 + (lVar17 - (long)pGVar3)) >> 2) * -0x55555555] == 0))
        {
          uVar10 = (uint)*(undefined8 *)pGVar15;
          if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                          ,0x414,
                          "int Cba_NtkInsertGiaObj(Cba_Ntk_t *, Gia_Man_t *, int, Vec_Int_t *, int)"
                         );
          }
          uVar10 = Cba_ObjAlloc(pNtk,(uint)((uVar10 & 0x1fffffff) <
                                           ((uint)((ulong)*(undefined8 *)pGVar15 >> 0x20) &
                                           0x1fffffff)) * 4 + CBA_BOX_AND,2,1);
          if ((int)uVar10 < 1) goto LAB_0033991c;
          if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
          piVar12 = (pNtk->vObjFin0).pArray;
          iVar9 = piVar12[uVar10];
          lVar19 = (long)iVar9;
          if (lVar19 < 1) goto LAB_0033988b;
          if ((pNtk->vFinFon).nSize <= iVar9) goto LAB_0033986c;
          piVar5 = (pNtk->vFinFon).pArray;
          if (piVar5[lVar19] != 0) goto LAB_003398c9;
          piVar5[lVar19] = iVar6;
          if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
          iVar6 = piVar12[uVar10];
          if (iVar6 < 0) goto LAB_0033988b;
          uVar7 = iVar6 + 1;
          if ((pNtk->vFinFon).nSize <= (int)uVar7) goto LAB_0033986c;
          if (piVar5[uVar7] != 0) goto LAB_003398c9;
          piVar5[uVar7] = iVar8;
        }
        else {
          iVar9 = Cba_NtkInsertGiaLit(pNtk,-(uint)(puVar4[lVar16] == 0) | puVar4[lVar16],vLit2Fon,
                                      fUseXor);
          uVar10 = Cba_ObjAlloc(pNtk,CBA_BOX_MUX,3,1);
          if ((int)uVar10 < 1) goto LAB_0033991c;
          if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
          piVar12 = (pNtk->vObjFin0).pArray;
          lVar19 = (long)piVar12[uVar10];
          if (lVar19 < 1) goto LAB_0033988b;
          if ((pNtk->vFinFon).nSize <= piVar12[uVar10]) goto LAB_0033986c;
          piVar5 = (pNtk->vFinFon).pArray;
          if (piVar5[lVar19] != 0) goto LAB_003398c9;
          piVar5[lVar19] = iVar9;
          if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
          if (piVar12[uVar10] < 0) goto LAB_0033988b;
          uVar7 = piVar12[uVar10] + 1;
          if ((pNtk->vFinFon).nSize <= (int)uVar7) goto LAB_0033986c;
          if (piVar5[uVar7] != 0) goto LAB_003398c9;
          piVar5[uVar7] = iVar8;
          if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
          if (piVar12[uVar10] < -1) goto LAB_0033988b;
          uVar7 = piVar12[uVar10] + 2;
          if ((pNtk->vFinFon).nSize <= (int)uVar7) goto LAB_0033986c;
          if (piVar5[uVar7] != 0) goto LAB_003398c9;
          piVar5[uVar7] = iVar6;
        }
        if ((pNtk->vObjFon0).nSize <= (int)uVar10) goto LAB_0033986c;
        if (iVar14 <= iVar18) {
LAB_0033995a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar16 * 2] = (pNtk->vObjFon0).pArray[uVar10];
        iVar6 = pGia->nObjs;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0xc;
      iVar18 = iVar18 + 2;
    } while (lVar16 < iVar6);
  }
  pVVar13 = pGia->vCos;
  uVar20 = (ulong)(uint)pVVar13->nSize;
  if (0 < pVVar13->nSize) {
    lVar16 = 0;
    do {
      iVar14 = (int)uVar20;
      iVar6 = pVVar13->pArray[lVar16];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) goto LAB_003398aa;
      if (iVar6 == 0) break;
      iVar14 = iVar6 - (*(uint *)(pGia->pObjs + iVar6) & 0x1fffffff);
      if (iVar14 < 0) goto LAB_003398d2;
      Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar6) >> 0x1d & 1) + iVar14 * 2,vLit2Fon,
                          fUseXor);
      lVar16 = lVar16 + 1;
      pVVar13 = pGia->vCos;
      iVar14 = pVVar13->nSize;
      uVar20 = (ulong)iVar14;
    } while (lVar16 < (long)uVar20);
    if (0 < iVar14) {
      uVar20 = 0;
      do {
        iVar6 = pVVar13->pArray[uVar20];
        if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) {
LAB_003398aa:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (iVar6 == 0) break;
        iVar14 = iVar6 - (*(uint *)(pGia->pObjs + iVar6) & 0x1fffffff);
        if (iVar14 < 0) {
LAB_003398d2:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        iVar6 = Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar6) >> 0x1d & 1) + iVar14 * 2,
                                    vLit2Fon,fUseXor);
        uVar10 = Cba_ObjAlloc(pNtk,CBA_BOX_BUF,1,1);
        if ((int)uVar10 < 1) goto LAB_0033991c;
        if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
        iVar14 = (pNtk->vObjFin0).pArray[uVar10];
        lVar16 = (long)iVar14;
        if (lVar16 < 1) goto LAB_0033988b;
        if ((pNtk->vFinFon).nSize <= iVar14) goto LAB_0033986c;
        piVar12 = (pNtk->vFinFon).pArray;
        if (piVar12[lVar16] != 0) goto LAB_003398c9;
        piVar12[lVar16] = iVar6;
        if ((pNtk->vObjFon0).nSize <= (int)uVar10) goto LAB_0033986c;
        iVar6 = (pNtk->vObjFon0).pArray[uVar10];
        pVVar1 = pGia->vNamesOut;
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
          iVar14 = Cba_NtkNewStrId(pNtk,"o%d",uVar20 & 0xffffffff);
        }
        else {
          if ((long)pVVar1->nSize <= (long)uVar20) {
LAB_003399d6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar14 = Abc_NamStrFindOrAdd(p_00->pStrs,(char *)pVVar1->pArray[uVar20],(int *)0x0);
        }
        uVar10 = Cba_ObjAlloc(pNtk,CBA_OBJ_PO,1,0);
        Cba_ObjSetName(pNtk,uVar10,iVar14);
        if ((int)uVar10 < 1) goto LAB_0033991c;
        if ((pNtk->vObjFin0).nSize <= (int)uVar10) goto LAB_0033986c;
        iVar14 = (pNtk->vObjFin0).pArray[uVar10];
        lVar16 = (long)iVar14;
        if (lVar16 < 1) goto LAB_0033988b;
        if ((pNtk->vFinFon).nSize <= iVar14) goto LAB_0033986c;
        piVar12 = (pNtk->vFinFon).pArray;
        if (piVar12[lVar16] != 0) goto LAB_003398c9;
        piVar12[lVar16] = iVar6;
        uVar20 = uVar20 + 1;
        pVVar13 = pGia->vCos;
      } while ((long)uVar20 < (long)pVVar13->nSize);
    }
  }
  pVVar13 = &pNtk->vFonName;
  uVar10 = (pNtk->vFonObj).nCap;
  uVar7 = (pNtk->vFonName).nCap;
  if ((int)uVar7 < (int)uVar10) {
    piVar12 = (pNtk->vFonName).pArray;
    if (piVar12 == (int *)0x0) {
      piVar12 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar12 = (int *)realloc(piVar12,(long)(int)uVar10 << 2);
    }
    (pNtk->vFonName).pArray = piVar12;
    if (piVar12 == (int *)0x0) goto LAB_00339a14;
    pVVar13->nCap = uVar10;
    uVar7 = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar10 * 4);
    uVar7 = (pNtk->vFonName).nCap;
  }
  (pNtk->vFonName).nSize = uVar10;
  uVar10 = (pNtk->vFonObj).nCap;
  if ((int)uVar7 < (int)uVar10) {
    piVar12 = (pNtk->vFonName).pArray;
    if (piVar12 == (int *)0x0) {
      piVar12 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar12 = (int *)realloc(piVar12,(long)(int)uVar10 << 2);
    }
    (pNtk->vFonName).pArray = piVar12;
    if (piVar12 == (int *)0x0) {
LAB_00339a14:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar13->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vFonName).nSize = uVar10;
  if (0 < (pNtk->vInputs).nSize) {
    lVar16 = 0;
    do {
      iVar6 = (pNtk->vInputs).pArray[lVar16];
      lVar17 = (long)iVar6;
      if (lVar17 < 1) {
LAB_003398fd:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vObjFon0).nSize <= iVar6) goto LAB_0033986c;
      if ((pNtk->vFonName).nSize < 1) goto LAB_003398f1;
      uVar10 = (pNtk->vObjFon0).pArray[lVar17];
      if ((int)uVar10 < 1) {
        pcVar11 = "Cba_FonIsReal(f)";
        goto LAB_00339980;
      }
      Vec_IntFillExtra(pVVar13,uVar10 + 1,0);
      if ((pNtk->vFonName).nSize <= (int)uVar10) goto LAB_0033986c;
      if ((pNtk->vFonName).pArray[uVar10] == 0) {
        if ((pNtk->vObjName).nSize < 1) goto LAB_003399b7;
        Vec_IntFillExtra(p_01,iVar6 + 1,0);
        if ((pNtk->vObjName).nSize <= iVar6) goto LAB_0033986c;
        Cba_FonSetName(pNtk,uVar10,(pNtk->vObjName).pArray[lVar17]);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar16 = 0;
    do {
      iVar6 = (pNtk->vOutputs).pArray[lVar16];
      lVar17 = (long)iVar6;
      if (lVar17 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((pNtk->vObjFin0).nSize <= iVar6) {
LAB_0033986c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = (pNtk->vObjFin0).pArray[lVar17];
      if ((long)iVar14 < 1) {
LAB_0033988b:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vFinFon).nSize <= iVar14) goto LAB_0033986c;
      iVar14 = (pNtk->vFinFon).pArray[iVar14];
      if (0 < (long)iVar14) {
        if ((pNtk->vFonName).nSize < 1) {
LAB_003398f1:
          pcVar11 = "Cba_NtkHasFonNames(p)";
LAB_00339980:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(pVVar13,iVar14 + 1,0);
        if ((pNtk->vFonName).nSize <= iVar14) goto LAB_0033986c;
        if ((pNtk->vFonName).pArray[iVar14] == 0) {
          if ((pNtk->vObjName).nSize < 1) {
LAB_003399b7:
            __assert_fail("Cba_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x15d,"int Cba_ObjName(Cba_Ntk_t *, int)");
          }
          Vec_IntFillExtra(p_01,iVar6 + 1,0);
          if ((pNtk->vObjName).nSize <= iVar6) goto LAB_0033986c;
          Cba_FonSetName(pNtk,iVar14,(pNtk->vObjName).pArray[lVar17]);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < (pNtk->vOutputs).nSize);
  }
  Cba_NtkAddMissingFonNames(pNtk,"a");
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vLit2Fon);
  return p_00;
LAB_0033991c:
  pcVar11 = "i>0";
  goto LAB_00339923;
LAB_003398c9:
  pcVar11 = "Cba_ObjFinFon(p, i, k)== 0";
LAB_00339923:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

Cba_Man_t * Cba_ManDeriveFromGia( Gia_Man_t * pGia, int fUseXor )
{
    Cba_Man_t * p = Cba_ManAlloc( pGia->pSpec, 1, NULL, NULL, NULL, NULL );
    Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Abc_NamStrFindOrAdd(p->pStrs, pGia->pName, NULL), Gia_ManCiNum(pGia), Gia_ManCoNum(pGia), 1000, 2000, 2000 );
    Vec_Int_t * vLit2Fon = Vec_IntStartFull( 2*Gia_ManObjNum(pGia) );
    int i, iObj, iObjNew, NameId, iLit0, iFon0;
    Gia_Obj_t * pObj;
    //Cba_ManPrepareTypeNames( p );
    Cba_NtkAdd( p, pNtk );
    Cba_NtkCleanObjNames( pNtk );
    Gia_ManForEachCiId( pGia, iObj, i )
    {
        NameId = pGia->vNamesIn? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesIn, i), NULL) : Cba_NtkNewStrId(pNtk, "i%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Vec_IntWriteEntry( vLit2Fon, Abc_Var2Lit(iObj, 0), Cba_ObjFon0(pNtk, iObjNew) );
    }
    Gia_ManForEachAndId( pGia, iObj )
        Cba_NtkInsertGiaObj( pNtk, pGia, iObj, vLit2Fon, fUseXor );
    // create inverters if needed
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
    }
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
        iObjNew = Cba_ObjAlloc( pNtk, CBA_BOX_BUF, 1, 1 );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
        iFon0 = Cba_ObjFon0(pNtk, iObjNew); // non-const fon unique for this output
        NameId = pGia->vNamesOut? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesOut, i), NULL) : Cba_NtkNewStrId(pNtk, "o%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
    }
    Cba_NtkCleanFonNames( pNtk );
    Cba_NtkCreateFonNames( pNtk, "a" );
    Vec_IntFree( vLit2Fon );
    return p;
}